

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,int *nonz,int n)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  type_conflict5 tVar2;
  bool bVar3;
  long in_RCX;
  long in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  int in_R8D;
  int m;
  int *lbeg;
  int *lrow;
  int *lidx;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int end;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc38;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc40;
  cpp_dec_float<50U,_int,_void> *this_00;
  self_type *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  undefined1 local_398 [56];
  undefined1 local_360 [8];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffca8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcb0;
  undefined1 local_328 [56];
  undefined1 local_2f0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  undefined1 local_280 [56];
  undefined4 local_248;
  int local_244;
  undefined8 local_240;
  long local_238;
  long local_230;
  long local_228;
  int *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  undefined1 local_204 [56];
  cpp_dec_float<50U,_int,_void> local_1cc;
  uint local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  long local_180;
  long local_178;
  undefined8 local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  cpp_dec_float<50U,_int,_void> *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  long local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  long local_e0;
  long local_d8;
  undefined1 *local_d0;
  long local_c8;
  cpp_dec_float<50U,_int,_void> *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  cpp_dec_float<50U,_int,_void> *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  cpp_dec_float<50U,_int,_void> *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<50U,_int,_void> *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  cpp_dec_float<50U,_int,_void> *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_148 = &local_1cc;
  local_184 = in_R8D;
  local_180 = in_RCX;
  local_178 = in_RDX;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffc40);
  local_140 = local_204;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffc40);
  local_218 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x3a33e0);
  local_228 = *(long *)(in_RDI[6].data._M_elems + 6);
  local_230 = *(long *)in_RDI[7].data._M_elems;
  local_238._0_4_ = in_RDI[6].fpclass;
  local_238._4_4_ = in_RDI[6].prec_elem;
  local_194 = in_RDI[6].data._M_elems[9];
  local_188 = in_RDI[6].exp;
  while (local_188 = local_188 + -1, (int)local_194 <= local_188) {
    local_c8 = local_178 + (long)*(int *)(local_230 + (long)local_188 * 4) * 0x38;
    this_00 = &local_1cc;
    local_c0 = this_00;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (this_00,in_stack_fffffffffffffc38);
    local_240 = 0;
    tVar2 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffc38,(double *)0x3a34c1);
    if (tVar2) {
      local_190 = *(int *)(local_238 + (long)local_188 * 4);
      local_210 = local_218 + local_190;
      local_220 = (int *)(local_228 + (long)local_190 * 4);
      for (local_18c = *(int *)(local_238 + (long)(local_188 + 1) * 4); local_190 < local_18c;
          local_18c = local_18c + -1) {
        local_244 = *local_220;
        local_d8 = local_178 + (long)local_244 * 0x38;
        local_d0 = local_204;
        local_220 = local_220 + 1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (this_00,in_stack_fffffffffffffc38);
        local_248 = 0;
        tVar2 = boost::multiprecision::operator==(in_RSI,(int *)this_00);
        pnVar1 = local_210;
        if (tVar2) {
          local_20 = &local_2b8;
          local_28 = &local_1cc;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_28);
          local_10 = &local_2b8;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (this_00,in_stack_fffffffffffffc38);
          local_8 = &local_2b8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(this_00);
          pnVar1 = local_210;
          local_58 = local_280;
          local_60 = &local_2b8;
          local_68 = local_210;
          local_210 = local_210 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_69,local_60,pnVar1);
          local_50 = local_280;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
          local_38 = local_280;
          local_40 = local_60;
          local_48 = local_68;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (this_00,in_stack_fffffffffffffc38,(cpp_dec_float<50U,_int,_void> *)0x3a372f);
          local_f0 = local_204;
          local_f8 = local_280;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (this_00,in_stack_fffffffffffffc38);
          local_130 = local_2f0;
          local_138 = local_204;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (this_00,in_stack_fffffffffffffc38);
          local_120 = local_328;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (this_00,in_stack_fffffffffffffc38);
          bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
          if (bVar3) {
            local_e0 = local_178 + (long)local_244 * 0x38;
            local_e8 = local_204;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (this_00,in_stack_fffffffffffffc38);
            *(int *)(local_180 + (long)local_184 * 4) = local_244;
            local_184 = local_184 + 1;
          }
        }
        else {
          local_98 = local_360;
          local_a0 = &local_1cc;
          local_a8 = local_210;
          local_210 = local_210 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_a9,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_a0,pnVar1);
          local_90 = local_360;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
          local_78 = local_360;
          local_80 = local_a0;
          local_88 = local_a8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (this_00,in_stack_fffffffffffffc38,(cpp_dec_float<50U,_int,_void> *)0x3a3914);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc58);
          in_stack_fffffffffffffc64 = 0;
          tVar2 = boost::multiprecision::operator!=(in_RSI,(int *)this_00);
          if (tVar2) {
            local_110 = local_398;
            local_118 = local_204;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (this_00,in_stack_fffffffffffffc38);
          }
          else {
            in_stack_fffffffffffffc58 = (self_type *)0x2b2bff2ee48e0530;
            local_150 = local_398;
            local_158 = &stack0xfffffffffffffc58;
            local_160 = 0;
            local_b8 = local_158;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (in_RDI,(double)in_RSI,this_00);
          }
          local_100 = local_178 + (long)local_244 * 0x38;
          local_108 = local_398;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (this_00,in_stack_fffffffffffffc38);
        }
      }
    }
  }
  return local_184;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}